

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv4Transmitter::WaitForIncomingData
          (RTPUDPv4Transmitter *this,RTPTime *delay,bool *dataavailable)

{
  int iVar1;
  int8_t readflags [3];
  char local_2c [4];
  undefined8 local_28;
  SocketType local_20;
  
  iVar1 = -0x5a;
  if (((this->init == true) && (iVar1 = -0x59, this->created == true)) &&
     (iVar1 = -0x48, this->waitingfordata == false)) {
    local_20 = this->m_pAbortDesc->m_descriptors[0];
    local_28._0_4_ = this->rtpsock;
    local_28._4_4_ = this->rtcpsock;
    local_2c[2] = '\0';
    local_2c[0] = '\0';
    local_2c[1] = '\0';
    this->waitingfordata = true;
    iVar1 = RTPSelect((SocketType *)&local_28,local_2c,3,(RTPTime)delay->m_t);
    this->waitingfordata = false;
    if ((-1 < iVar1) && (iVar1 = 0, this->created == true)) {
      if (local_2c[2] != '\0') {
        RTPAbortDescriptors::ReadSignallingByte(this->m_pAbortDesc);
      }
      iVar1 = 0;
      if (dataavailable != (bool *)0x0) {
        *dataavailable = local_2c[1] != '\0' || local_2c[0] != '\0';
      }
    }
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_ALREADYWAITING;
	}
	
	SocketType abortSocket = m_pAbortDesc->GetAbortSocket();

	SocketType socks[3] = { rtpsock, rtcpsock, abortSocket };
	int8_t readflags[3] = { 0, 0, 0 };
	const int idxRTP = 0;
	const int idxRTCP = 1;
	const int idxAbort = 2;
	
	waitingfordata = true;
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	int status = RTPSelect(socks, readflags, 3, delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		waitingfordata = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	waitingfordata = false;
	if (!created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (readflags[idxAbort])
		m_pAbortDesc->ReadSignallingByte();

	if (dataavailable != 0)
	{
		if (readflags[idxRTP] || readflags[idxRTCP])
			*dataavailable = true;
		else
			*dataavailable = false;
	}	
	
	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}